

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

Time __thiscall helics::EndpointInfo::firstMessageTime(EndpointInfo *this)

{
  bool bVar1;
  pointer pMVar2;
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_RDI;
  shared_handle handle;
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffffd8;
  baseType local_8;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffffd8);
  gmlc::libguarded::
  shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::operator->((shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
                *)&stack0xffffffffffffffd8);
  bVar1 = std::
          deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::empty((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)0x5dd60a);
  if (bVar1) {
    local_8 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  else {
    gmlc::libguarded::
    shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
    ::operator->((shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
                  *)&stack0xffffffffffffffd8);
    std::
    deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::front(in_RDI);
    pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                       ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x5dd634);
    local_8 = (pMVar2->time).internalTimeCode;
  }
  gmlc::libguarded::
  shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
              *)0x5dd644);
  return (Time)local_8;
}

Assistant:

Time EndpointInfo::firstMessageTime() const
{
    auto handle = message_queue.lock_shared();
    return (handle->empty()) ? Time::maxVal() : handle->front()->time;
}